

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsHeaderDAC(uint arg_count,long *arg_array)

{
  uchar uVar1;
  
  if (arg_count != 0) {
    CheckedChannelPointer((uint)*arg_array);
    if (arg_count == 1) {
      uVar1 = '\0';
    }
    else {
      uVar1 = (uchar)arg_array[1];
    }
    MemoryStream_WriteByte(output_stream,uVar1);
    if (arg_count < 3) {
      uVar1 = '\0';
    }
    else {
      uVar1 = (uchar)arg_array[2];
    }
    MemoryStream_WriteByte(output_stream,uVar1);
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x1c0,"void Macro_smpsHeaderDAC(unsigned int, long *)");
}

Assistant:

static void Macro_smpsHeaderDAC(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	CheckedChannelPointer(arg_array[0]);		// Location
	WriteByte((arg_count >= 2) ? arg_array[1] : 0);	// Pitch
	WriteByte((arg_count >= 3) ? arg_array[2] : 0);	// Volume
}